

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

Abc_Ntk_t * Abc_FlowRetime_NtkSilentRestrash(Abc_Ntk_t *pNtk,int fCleanup)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pAVar6;
  Abc_Ntk_t *pAVar7;
  long lVar8;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pVVar5 = pNtk->vObjs;
    if (0 < pVVar5->nSize) {
      lVar8 = 0;
      do {
        plVar2 = (long *)pVVar5->pArray[lVar8];
        if ((plVar2 != (long *)0x0) && (uVar1 = *(uint *)((long)plVar2 + 0x14), (uVar1 & 0xf) == 7))
        {
          lVar3 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
          pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(uVar1 >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar3 + (long)*(int *)plVar2[4] * 8) + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(uVar1 >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar3 + (long)((int *)plVar2[4])[1] * 8) + 0x40))
                             );
          plVar2[8] = (long)pAVar6;
        }
        lVar8 = lVar8 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar8 < pVVar5->nSize);
    }
    Abc_NtkFinalize(pNtk,pNtkNew);
    if (fCleanup != 0) {
      Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar7 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar7;
    }
    iVar4 = Abc_NtkCheck(pNtkNew);
    if (iVar4 == 0) {
      puts("Abc_NtkStrash: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                ,0x4a5,"Abc_Ntk_t *Abc_FlowRetime_NtkSilentRestrash(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_FlowRetime_NtkSilentRestrash( Abc_Ntk_t * pNtk, int fCleanup )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i, nNodes;//, RetValue;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // perform cleanup if requested
    if ( fCleanup )
      nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc);
    // duplicate EXDC 
    if ( pNtk->pExdc )
      pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
      {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
      }
    return pNtkAig;
}